

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::DeleteFromSEL(Clipper *this,TEdge *e)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge **ppTVar3;
  
  pTVar1 = e->NextInSEL;
  pTVar2 = e->PrevInSEL;
  if (((pTVar2 == (TEdge *)0x0) && (pTVar1 == (TEdge *)0x0)) && (this->m_SortedEdges != e)) {
    return;
  }
  ppTVar3 = &pTVar2->NextInSEL;
  if (pTVar2 == (TEdge *)0x0) {
    ppTVar3 = &this->m_SortedEdges;
  }
  *ppTVar3 = pTVar1;
  if (pTVar1 != (TEdge *)0x0) {
    pTVar1->PrevInSEL = pTVar2;
  }
  e->NextInSEL = (TEdge *)0x0;
  e->PrevInSEL = (TEdge *)0x0;
  return;
}

Assistant:

void Clipper::DeleteFromSEL(TEdge *e)
{
  TEdge* SelPrev = e->PrevInSEL;
  TEdge* SelNext = e->NextInSEL;
  if( !SelPrev &&  !SelNext && (e != m_SortedEdges) ) return; //already deleted
  if( SelPrev ) SelPrev->NextInSEL = SelNext;
  else m_SortedEdges = SelNext;
  if( SelNext ) SelNext->PrevInSEL = SelPrev;
  e->NextInSEL = 0;
  e->PrevInSEL = 0;
}